

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_xy(secp256k1_ge *r,secp256k1_fe *x,secp256k1_fe *y)

{
  void *in_RDX;
  secp256k1_ge *in_RSI;
  void *in_RDI;
  
  secp256k1_fe_verify(&in_RSI->x);
  secp256k1_fe_verify(&in_RSI->x);
  *(undefined4 *)((long)in_RDI + 0x60) = 0;
  memcpy(in_RDI,in_RSI,0x30);
  memcpy((void *)((long)in_RDI + 0x30),in_RDX,0x30);
  secp256k1_ge_verify(in_RSI);
  return;
}

Assistant:

static void secp256k1_ge_set_xy(secp256k1_ge *r, const secp256k1_fe *x, const secp256k1_fe *y) {
    SECP256K1_FE_VERIFY(x);
    SECP256K1_FE_VERIFY(y);

    r->infinity = 0;
    r->x = *x;
    r->y = *y;

    SECP256K1_GE_VERIFY(r);
}